

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void __thiscall helics::MessageHolder::freeMessage(MessageHolder *this,int index)

{
  pointer puVar1;
  tuple<helics::Message_*,_std::default_delete<helics::Message>_> tVar2;
  int local_c;
  
  if ((-1 < index) &&
     (puVar1 = (this->messages).
               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     index < (int)((ulong)((long)(this->messages).
                                 super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 3)))
  {
    tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
    super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
         *(_Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_> *)
          &puVar1[(uint)index]._M_t.
           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>;
    if (tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl !=
        (_Head_base<0UL,_helics::Message_*,_false>)0x0) {
      *(undefined8 *)
       ((long)tVar2.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xf8) = 0;
      ((((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
        (puVar1 + (uint)index))->_M_t).
       super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)->messageValidation = 0;
      local_c = index;
      std::__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>::reset
                ((__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_> *)
                 (puVar1 + (uint)index),(pointer)0x0);
      std::vector<int,_std::allocator<int>_>::push_back(&this->freeMessageSlots,&local_c);
    }
  }
  return;
}

Assistant:

void MessageHolder::freeMessage(int index)
{
    if (isValidIndex(index, messages)) {
        if (messages[index]) {
            messages[index]->backReference = nullptr;
            messages[index]->messageValidation = 0;
            messages[index].reset();
            freeMessageSlots.push_back(index);
        }
    }
}